

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::GpuCounterDescriptor::GpuCounterDescriptor
          (GpuCounterDescriptor *this,GpuCounterDescriptor *param_1)

{
  pointer pGVar1;
  pointer pGVar2;
  uint64_t uVar3;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__GpuCounterDescriptor_00406ed8;
  pGVar1 = (param_1->specs_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->specs_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->specs_).
       super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->specs_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = pGVar1;
  (this->specs_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->specs_).
       super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->specs_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->specs_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->specs_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pGVar2 = (param_1->blocks_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->blocks_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->blocks_).
       super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->blocks_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = pGVar2;
  (this->blocks_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->blocks_).
       super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->blocks_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->blocks_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->blocks_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->supports_instrumented_sampling_ = param_1->supports_instrumented_sampling_;
  uVar3 = param_1->max_sampling_period_ns_;
  this->min_sampling_period_ns_ = param_1->min_sampling_period_ns_;
  this->max_sampling_period_ns_ = uVar3;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

GpuCounterDescriptor::GpuCounterDescriptor(GpuCounterDescriptor&&) noexcept = default;